

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_fppowi(ASMState *as,IRIns *ir)

{
  RegSet local_1c;
  RegSet drop;
  IRIns *ir_local;
  ASMState *as_local;
  
  local_1c = 0x30001;
  if (((ir->field_1).r & 0x80) == 0) {
    local_1c = (1 << ((ir->field_1).r & 0x1f) ^ 0xffffffffU) & 0x30001;
  }
  ra_evictset(as,local_1c);
  ra_destreg(as,ir,0x10);
  emit_call_(as,(MCode *)lj_vm_powi_sse);
  ra_left(as,0x10,(uint)(ir->field_0).op1);
  ra_left(as,0,(uint)(ir->field_0).op2);
  return;
}

Assistant:

static void asm_fppowi(ASMState *as, IRIns *ir)
{
  /* The modified regs must match with the *.dasc implementation. */
  RegSet drop = RSET_RANGE(RID_XMM0, RID_XMM1+1)|RID2RSET(RID_EAX);
  if (ra_hasreg(ir->r))
    rset_clear(drop, ir->r);  /* Dest reg handled below. */
  ra_evictset(as, drop);
  ra_destreg(as, ir, RID_XMM0);
  emit_call(as, lj_vm_powi_sse);
  ra_left(as, RID_XMM0, ir->op1);
  ra_left(as, RID_EAX, ir->op2);
}